

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

bool re2::IsAnchorEnd(Regexp **pre,int depth)

{
  bool bVar1;
  RegexpOp RVar2;
  int iVar3;
  int iVar4;
  Regexp *pRVar5;
  Regexp *this;
  Regexp **ppRVar6;
  Regexp *pRVar7;
  int in_ESI;
  undefined8 *in_RDI;
  int i;
  PODArray<re2::Regexp_*> subcopy;
  Regexp *sub;
  Regexp *re;
  ParseFlags in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  PODArray<re2::Regexp_*> *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff68;
  ParseFlags in_stack_ffffffffffffff6c;
  Regexp *in_stack_ffffffffffffff70;
  Rune *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  Regexp *in_stack_ffffffffffffffa0;
  int local_48;
  undefined4 in_stack_ffffffffffffffe8;
  
  pRVar7 = (Regexp *)*in_RDI;
  if ((pRVar7 != (Regexp *)0x0) && (in_ESI < 4)) {
    RVar2 = Regexp::op(pRVar7);
    if (RVar2 == kRegexpConcat) {
      iVar3 = Regexp::nsub(pRVar7);
      if (0 < iVar3) {
        Regexp::sub(pRVar7);
        Regexp::nsub(pRVar7);
        pRVar5 = Regexp::Incref((Regexp *)
                                CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        bVar1 = IsAnchorEnd((Regexp **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                            (int)((ulong)pRVar7 >> 0x20));
        if (bVar1) {
          Regexp::nsub(pRVar7);
          PODArray<re2::Regexp_*>::PODArray
                    ((PODArray<re2::Regexp_*> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c)
          ;
          Regexp::nsub(pRVar7);
          this = (Regexp *)
                 PODArray<re2::Regexp_*>::operator[]
                           (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
          *(Regexp **)this = pRVar5;
          local_48 = 0;
          while (iVar3 = local_48, iVar4 = Regexp::nsub(pRVar7), iVar3 < iVar4 + -1) {
            Regexp::sub(pRVar7);
            pRVar5 = Regexp::Incref((Regexp *)CONCAT44(iVar3,in_stack_ffffffffffffff88));
            ppRVar6 = PODArray<re2::Regexp_*>::operator[]
                                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
            *ppRVar6 = pRVar5;
            local_48 = local_48 + 1;
          }
          PODArray<re2::Regexp_*>::data((PODArray<re2::Regexp_*> *)0x21e933);
          Regexp::nsub(pRVar7);
          Regexp::parse_flags(pRVar7);
          pRVar7 = Regexp::Concat((Regexp **)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                                  in_stack_ffffffffffffff48);
          *in_RDI = pRVar7;
          Regexp::Decref(this);
          PODArray<re2::Regexp_*>::~PODArray((PODArray<re2::Regexp_*> *)0x21e9a1);
          return true;
        }
        Regexp::Decref(in_stack_ffffffffffffffa0);
      }
    }
    else if (RVar2 == kRegexpCapture) {
      Regexp::sub(pRVar7);
      Regexp::Incref((Regexp *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      bVar1 = IsAnchorEnd((Regexp **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                          (int)((ulong)pRVar7 >> 0x20));
      if (bVar1) {
        Regexp::parse_flags(pRVar7);
        Regexp::cap(pRVar7);
        pRVar7 = Regexp::Capture(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                                 in_stack_ffffffffffffff68);
        *in_RDI = pRVar7;
        Regexp::Decref(in_stack_ffffffffffffffa0);
        return true;
      }
      Regexp::Decref(in_stack_ffffffffffffffa0);
    }
    else if (RVar2 == kRegexpEndText) {
      Regexp::parse_flags(pRVar7);
      pRVar7 = Regexp::LiteralString
                         (in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                          (ParseFlags)in_stack_ffffffffffffff70);
      *in_RDI = pRVar7;
      Regexp::Decref(in_stack_ffffffffffffffa0);
      return true;
    }
    return false;
  }
  return false;
}

Assistant:

static bool IsAnchorEnd(Regexp** pre, int depth) {
  Regexp* re = *pre;
  Regexp* sub;
  // The depth limit makes sure that we don't overflow
  // the stack on a deeply nested regexp.  As the comment
  // above says, IsAnchorEnd is conservative, so returning
  // a false negative is okay.  The exact limit is somewhat arbitrary.
  if (re == NULL || depth >= 4)
    return false;
  switch (re->op()) {
    default:
      break;
    case kRegexpConcat:
      if (re->nsub() > 0) {
        sub = re->sub()[re->nsub() - 1]->Incref();
        if (IsAnchorEnd(&sub, depth+1)) {
          PODArray<Regexp*> subcopy(re->nsub());
          subcopy[re->nsub() - 1] = sub;  // already have reference
          for (int i = 0; i < re->nsub() - 1; i++)
            subcopy[i] = re->sub()[i]->Incref();
          *pre = Regexp::Concat(subcopy.data(), re->nsub(), re->parse_flags());
          re->Decref();
          return true;
        }
        sub->Decref();
      }
      break;
    case kRegexpCapture:
      sub = re->sub()[0]->Incref();
      if (IsAnchorEnd(&sub, depth+1)) {
        *pre = Regexp::Capture(sub, re->parse_flags(), re->cap());
        re->Decref();
        return true;
      }
      sub->Decref();
      break;
    case kRegexpEndText:
      *pre = Regexp::LiteralString(NULL, 0, re->parse_flags());
      re->Decref();
      return true;
  }
  return false;
}